

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O3

void __thiscall UdpSocket::Implementation::Bind(Implementation *this,IpEndpointName *localEndpoint)

{
  int iVar1;
  runtime_error *this_00;
  uint uVar2;
  ushort uVar3;
  sockaddr local_20;
  
  local_20.sa_data[6] = '\0';
  local_20.sa_data[7] = '\0';
  local_20.sa_data[8] = '\0';
  local_20.sa_data[9] = '\0';
  local_20.sa_data[10] = '\0';
  local_20.sa_data[0xb] = '\0';
  local_20.sa_data[0xc] = '\0';
  local_20.sa_data[0xd] = '\0';
  local_20.sa_family = 2;
  uVar2 = (uint)localEndpoint->address;
  local_20.sa_data._2_4_ =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  if (localEndpoint->address == 0xffffffff) {
    local_20.sa_data._2_4_ = 0;
  }
  uVar3 = (ushort)localEndpoint->port;
  local_20.sa_data._0_2_ = uVar3 << 8 | uVar3 >> 8;
  if (localEndpoint->port == -1) {
    local_20.sa_data._0_2_ = 0;
  }
  iVar1 = bind(this->socket_,&local_20,0x10);
  if (-1 < iVar1) {
    this->isBound_ = true;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"unable to bind udp socket\n");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Bind( const IpEndpointName& localEndpoint )
	{
		struct sockaddr_in bindSockAddr;
		SockaddrFromIpEndpointName( bindSockAddr, localEndpoint );

        if (bind(socket_, (struct sockaddr *)&bindSockAddr, sizeof(bindSockAddr)) < 0) {
            throw std::runtime_error("unable to bind udp socket\n");
        }

		isBound_ = true;
	}